

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcRelVoidsElement::~IfcRelVoidsElement(IfcRelVoidsElement *this)

{
  ~IfcRelVoidsElement(this);
  operator_delete(this,0xe0);
  return;
}

Assistant:

IfcRelVoidsElement() : Object("IfcRelVoidsElement") {}